

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

int __thiscall
TPZBlockDiagonal<std::complex<float>_>::Decompose_LU(TPZBlockDiagonal<std::complex<float>_> *this)

{
  char cVar1;
  int iVar2;
  long lVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  complex<float> *__s;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  list<long,_std::allocator<long>_> singular;
  TPZFMatrix<std::complex<float>_> temp;
  _List_node_base local_d8;
  undefined8 local_c8;
  TPZFMatrix<std::complex<float>_> local_c0;
  
  cVar1 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed;
  if (cVar1 != '\0') {
    if (cVar1 == '\x01') {
      return 1;
    }
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZBlockDiagonal<std::complex<float>>::Decompose_LU() [TVar = std::complex<float>]"
               ,"TPZBlockDiagonal::Decompose_LU is already decomposed with other scheme");
  }
  lVar3 = (this->fBlockSize).fNElements;
  if (0 < lVar3) {
    lVar7 = 0;
    do {
      iVar2 = (this->fBlockSize).fStore[lVar7];
      lVar8 = (long)iVar2;
      if (lVar8 != 0) {
        local_c0.fElem = (this->fStorage).fStore + (this->fBlockPos).fStore[lVar7];
        uVar6 = (ulong)(uint)(iVar2 * iVar2);
        local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
        local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar8;
        local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar8;
        local_c0.fGiven = local_c0.fElem;
        local_c0.fSize = uVar6;
        TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
        local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
        local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
        local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
        local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
        local_c0.fWork.fStore = (complex<float> *)0x0;
        local_c0.fWork.fNElements = 0;
        local_c0.fWork.fNAlloc = 0;
        uVar9 = lVar8 * lVar8;
        if (uVar6 <= uVar9 && uVar9 - uVar6 != 0) {
          __s = (complex<float> *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8);
          memset(__s,0,uVar9 * 8);
          local_c0.fElem = __s;
        }
        local_c8 = 0;
        local_d8._M_next = &local_d8;
        local_d8._M_prev = &local_d8;
        TPZFMatrix<std::complex<float>_>::Decompose_LU
                  (&local_c0,(list<long,_std::allocator<long>_> *)&local_d8);
        p_Var5 = local_d8._M_next;
        while (p_Var5 != &local_d8) {
          p_Var4 = (((_List_base<long,_std::allocator<long>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
                   super__List_node_base._M_next;
          operator_delete(p_Var5,0x18);
          p_Var5 = p_Var4;
        }
        TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_c0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar3);
  }
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\x01';
  return 1;
}

Assistant:

int TPZBlockDiagonal<TVar>::Decompose_LU()
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZBlockDiagonal::Decompose_LU");
#endif
	
	if (  this->fDecomposed && this->fDecomposed == ELU) {
		return ELU;
	} else if(this->fDecomposed) {
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZBlockDiagonal::Decompose_LU is already decomposed with other scheme");
	}
	
	int64_t b,nb,pos;
	int bsize;
	nb = fBlockSize.NElements();
	for(b=0;b<nb; b++) {
		pos = fBlockPos[b];
		bsize = fBlockSize[b];
		if(!bsize) continue;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
            std::stringstream mess;
            mess << "TPZBlockDiagonal::Decompose_LU() - bsize = " << bsize << ", bsize*bsize = " << bsize*bsize;
            LOGPZ_DEBUG(logger,mess.str());
        }
#endif
		
		TPZFMatrix<TVar> temp(bsize,bsize,&fStorage[pos],bsize*bsize);
		std::list<int64_t> singular;
		temp.Decompose_LU(singular);
	}
	this->fDecomposed = ELU;
	return 1;
}